

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

void __thiscall
pbrt::ImageInfiniteLight::ImageInfiniteLight
          (ImageInfiniteLight *this,Transform renderFromLight,Image *im,
          RGBColorSpace *imageColorSpace,Float scale,string *filename,Allocator alloc)

{
  Image *this_00;
  Tuple2<pbrt::Point2,_int> TVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  long in_FS_OFFSET;
  float fVar5;
  double dVar6;
  undefined1 auVar7 [16];
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  Array2D<float> d;
  Bounds2f domain;
  Tuple2<pbrt::Point2,_float> local_e8;
  size_t vb;
  string local_c0 [32];
  string local_a0 [64];
  ImageChannelDesc channelDesc;
  
  (this->super_LightBase).type = Infinite;
  this_00 = &this->image;
  *(undefined8 *)(this->super_LightBase).renderFromLight.m.m[0] = renderFromLight.m.m[0]._0_8_;
  *(undefined8 *)((this->super_LightBase).renderFromLight.m.m[0] + 2) = renderFromLight.m.m[0]._8_8_
  ;
  *(undefined8 *)(this->super_LightBase).renderFromLight.m.m[1] = renderFromLight.m.m[1]._0_8_;
  *(undefined8 *)((this->super_LightBase).renderFromLight.m.m[1] + 2) = renderFromLight.m.m[1]._8_8_
  ;
  *(undefined8 *)(this->super_LightBase).renderFromLight.m.m[2] = renderFromLight.m.m[2]._0_8_;
  *(undefined8 *)((this->super_LightBase).renderFromLight.m.m[2] + 2) = renderFromLight.m.m[2]._8_8_
  ;
  *(undefined8 *)(this->super_LightBase).renderFromLight.m.m[3] = renderFromLight.m.m[3]._0_8_;
  *(undefined8 *)((this->super_LightBase).renderFromLight.m.m[3] + 2) = renderFromLight.m.m[3]._8_8_
  ;
  *(undefined8 *)(this->super_LightBase).renderFromLight.mInv.m[0] = renderFromLight.mInv.m[0]._0_8_
  ;
  *(undefined8 *)((this->super_LightBase).renderFromLight.mInv.m[0] + 2) =
       renderFromLight.mInv.m[0]._8_8_;
  *(undefined8 *)(this->super_LightBase).renderFromLight.mInv.m[1] = renderFromLight.mInv.m[1]._0_8_
  ;
  *(undefined8 *)((this->super_LightBase).renderFromLight.mInv.m[1] + 2) =
       renderFromLight.mInv.m[1]._8_8_;
  *(undefined8 *)(this->super_LightBase).renderFromLight.mInv.m[2] = renderFromLight.mInv.m[2]._0_8_
  ;
  *(undefined8 *)((this->super_LightBase).renderFromLight.mInv.m[2] + 2) =
       renderFromLight.mInv.m[2]._8_8_;
  *(undefined8 *)(this->super_LightBase).renderFromLight.mInv.m[3] = renderFromLight.mInv.m[3]._0_8_
  ;
  *(undefined8 *)((this->super_LightBase).renderFromLight.mInv.m[3] + 2) =
       renderFromLight.mInv.m[3]._8_8_;
  (this->super_LightBase).mediumInterface.inside.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = 0;
  (this->super_LightBase).mediumInterface.outside.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = 0;
  *(long *)(in_FS_OFFSET + -0x470) = *(long *)(in_FS_OFFSET + -0x470) + 1;
  Image::Image(this_00,im);
  this->imageColorSpace = imageColorSpace;
  this->scale = scale;
  (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  PiecewiseConstant2D::PiecewiseConstant2D(&this->distribution,alloc);
  PiecewiseConstant2D::PiecewiseConstant2D(&this->compensatedDistribution,alloc);
  std::__cxx11::string::string<std::allocator<char>>((string *)&vb,"R",(allocator<char> *)&d);
  std::__cxx11::string::string<std::allocator<char>>(local_c0,"G",(allocator<char> *)&domain);
  std::__cxx11::string::string<std::allocator<char>>(local_a0,"B",(allocator<char> *)&local_e8);
  requestedChannels.n = 3;
  requestedChannels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vb;
  Image::GetChannelDesc(&channelDesc,this_00,requestedChannels);
  lVar4 = 0x40;
  do {
    std::__cxx11::string::~string((string *)((long)&vb + lVar4));
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x20);
  if (channelDesc.offset.nStored == 0) {
    ErrorExit<std::__cxx11::string&>
              ("%s: image used for ImageInfiniteLight doesn\'t have R, G, B channels.",filename);
  }
  d.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x = 3;
  vb = channelDesc.offset.nStored;
  if (channelDesc.offset.nStored != 3) {
    LogFatal<char_const(&)[2],char_const(&)[19],char_const(&)[2],int&,char_const(&)[19],unsigned_long&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lights.cpp"
               ,0x3ac,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [2])0x52a601,
               (char (*) [19])"channelDesc.size()",(char (*) [2])0x52a601,(int *)&d,
               (char (*) [19])"channelDesc.size()",(unsigned_long *)&vb);
  }
  bVar2 = ImageChannelDesc::IsIdentity(&channelDesc);
  if (bVar2) {
    TVar1 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>;
    if (TVar1.x == TVar1.y) {
      Image::GetSamplingDistribution(&d,this_00);
      auVar7._8_4_ = 0x3f800000;
      auVar7._0_8_ = 0x3f8000003f800000;
      auVar7._12_4_ = 0x3f800000;
      vb = 0;
      local_e8 = (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(auVar7);
      Bounds2<float>::Bounds2(&domain,(Point2<float> *)&vb,(Point2<float> *)&local_e8);
      PiecewiseConstant2D::PiecewiseConstant2D((PiecewiseConstant2D *)&vb,&d,domain,alloc);
      PiecewiseConstant2D::operator=(&this->distribution,(PiecewiseConstant2D *)&vb);
      PiecewiseConstant2D::~PiecewiseConstant2D((PiecewiseConstant2D *)&vb);
      dVar6 = std::accumulate<float*,double>
                        (d.values,d.values +
                                  (d.extent.pMax.super_Tuple2<pbrt::Point2,_int>.y -
                                  d.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y) *
                                  (d.extent.pMax.super_Tuple2<pbrt::Point2,_int>.x -
                                  d.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x),0.0);
      iVar3 = (d.extent.pMax.super_Tuple2<pbrt::Point2,_int>.y -
              d.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y) *
              (d.extent.pMax.super_Tuple2<pbrt::Point2,_int>.x -
              d.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x);
      fVar5 = (float)(dVar6 / (double)iVar3);
      for (lVar4 = 0; (long)iVar3 * 4 != lVar4; lVar4 = lVar4 + 4) {
        auVar7 = vminss_avx(ZEXT416((uint)*(float *)((long)d.values + lVar4)),
                            ZEXT416((uint)(fVar5 * 0.001)));
        auVar7 = vmaxss_avx(auVar7,ZEXT416((uint)(*(float *)((long)d.values + lVar4) - fVar5)));
        *(int *)((long)d.values + lVar4) = auVar7._0_4_;
      }
      PiecewiseConstant2D::PiecewiseConstant2D((PiecewiseConstant2D *)&vb,&d,domain,alloc);
      PiecewiseConstant2D::operator=(&this->compensatedDistribution,(PiecewiseConstant2D *)&vb);
      PiecewiseConstant2D::~PiecewiseConstant2D((PiecewiseConstant2D *)&vb);
      Array2D<float>::~Array2D(&d);
      InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector
                (&channelDesc.offset);
      return;
    }
    d.extent.pMin.super_Tuple2<pbrt::Point2,_int> = TVar1;
    vb = (size_t)TVar1;
    ErrorExit<std::__cxx11::string&,int,int>
              ("%s: image resolution (%d, %d) is non-square. It\'s unlikely this is an equal area environment map."
               ,filename,(int *)&vb,&d.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y);
  }
  LogFatal<char_const(&)[25]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lights.cpp"
             ,0x3ad,"Check failed: %s",(char (*) [25])"channelDesc.IsIdentity()");
}

Assistant:

ImageInfiniteLight::ImageInfiniteLight(Transform renderFromLight, Image im,
                                       const RGBColorSpace *imageColorSpace, Float scale,
                                       std::string filename, Allocator alloc)
    : LightBase(LightType::Infinite, renderFromLight, MediumInterface()),
      image(std::move(im)),
      imageColorSpace(imageColorSpace),
      scale(scale),
      distribution(alloc),
      compensatedDistribution(alloc) {
    // Initialize sampling PDFs for image infinite area light
    ImageChannelDesc channelDesc = image.GetChannelDesc({"R", "G", "B"});
    if (!channelDesc)
        ErrorExit("%s: image used for ImageInfiniteLight doesn't have R, G, B "
                  "channels.",
                  filename);
    CHECK_EQ(3, channelDesc.size());
    CHECK(channelDesc.IsIdentity());
    if (image.Resolution().x != image.Resolution().y)
        ErrorExit("%s: image resolution (%d, %d) is non-square. It's unlikely "
                  "this is an equal area environment map.",
                  filename, image.Resolution().x, image.Resolution().y);
    Array2D<Float> d = image.GetSamplingDistribution();
    Bounds2f domain = Bounds2f(Point2f(0, 0), Point2f(1, 1));
    distribution = PiecewiseConstant2D(d, domain, alloc);

    // Initialize compensated PDF for image infinite area light
    Float average = std::accumulate(d.begin(), d.end(), 0.) / d.size();
    for (Float &v : d)
        v = std::max<Float>(v - average, std::min<Float>(.001f * average, v));
    compensatedDistribution = PiecewiseConstant2D(d, domain, alloc);
}